

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O1

void Llb_Nonlin4Print(Llb_Mgr_t_conflict *p)

{
  Llb_Var_t *pLVar1;
  Llb_Prt_t *pLVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  ulong uVar5;
  
  putchar(10);
  if (0 < p->nVars) {
    uVar5 = 0;
    do {
      pLVar1 = p->pVars[uVar5];
      if (pLVar1 != (Llb_Var_t *)0x0) {
        printf("Var %3d : ",uVar5 & 0xffffffff);
        pVVar3 = pLVar1->vParts;
        if (0 < pVVar3->nSize) {
          lVar4 = 0;
          do {
            printf("%d ",(ulong)(uint)p->pParts[pVVar3->pArray[lVar4]]->iPart);
            lVar4 = lVar4 + 1;
            pVVar3 = pLVar1->vParts;
          } while (lVar4 < pVVar3->nSize);
        }
        putchar(10);
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)p->nVars);
  }
  if (0 < p->iPartFree) {
    uVar5 = 0;
    do {
      pLVar2 = p->pParts[uVar5];
      if (pLVar2 != (Llb_Prt_t *)0x0) {
        printf("Part %3d : ",uVar5 & 0xffffffff);
        pVVar3 = pLVar2->vVars;
        if (0 < pVVar3->nSize) {
          lVar4 = 0;
          do {
            printf("%d ",(ulong)(uint)p->pVars[pVVar3->pArray[lVar4]]->iVar);
            lVar4 = lVar4 + 1;
            pVVar3 = pLVar2->vVars;
          } while (lVar4 < pVVar3->nSize);
        }
        putchar(10);
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)p->iPartFree);
  }
  return;
}

Assistant:

void Llb_Nonlin4Print( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i, k;
    printf( "\n" );
    Llb_MgrForEachVar( p, pVar, i )
    {
        printf( "Var %3d : ", i );
        Llb_VarForEachPart( p, pVar, pPart, k )
            printf( "%d ", pPart->iPart );
        printf( "\n" );
    }
    Llb_MgrForEachPart( p, pPart, i )
    {
        printf( "Part %3d : ", i );
        Llb_PartForEachVar( p, pPart, pVar, k )
            printf( "%d ", pVar->iVar );
        printf( "\n" );
    }
}